

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

void __thiscall
GEO::geofile::pull_points(geofile *this,vector<GEO::point,_std::allocator<GEO::point>_> *in_vector)

{
  pointer *pppVar1;
  iterator __position;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  double dVar4;
  _Rb_tree_node_base *p_Var5;
  _Self __tmp;
  
  if ((this->points_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var5 = (this->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->points_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      __position._M_current =
           (in_vector->super__Vector_base<GEO::point,_std::allocator<GEO::point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (in_vector->super__Vector_base<GEO::point,_std::allocator<GEO::point>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<GEO::point,std::allocator<GEO::point>>::_M_realloc_insert<GEO::point_const&>
                  ((vector<GEO::point,std::allocator<GEO::point>> *)in_vector,__position,
                   (point *)&p_Var5[1]._M_parent);
      }
      else {
        p_Var2 = p_Var5[1]._M_parent;
        p_Var3 = p_Var5[1]._M_left;
        dVar4 = *(double *)(p_Var5 + 2);
        (__position._M_current)->z = (double)p_Var5[1]._M_right;
        (__position._M_current)->char_len = dVar4;
        (__position._M_current)->x = (double)p_Var2;
        (__position._M_current)->y = (double)p_Var3;
        pppVar1 = &(in_vector->super__Vector_base<GEO::point,_std::allocator<GEO::point>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void GEO::geofile::pull_points(std::vector<GEO::point> &in_vector)
{
//std::map<int, point>            points_map;
    if (points_map.size()>0)
    {
        auto pm_end = points_map.end();
        for ( auto pm_it = points_map.begin();
             pm_it != pm_end; pm_it++)
        {
            in_vector.push_back(pm_it->second);
        }
    }
}